

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_geometry.cpp
# Opt level: O0

bool __thiscall
ON_Geometry::GetBoundingBox(ON_Geometry *this,ON_3dPoint *boxmin,ON_3dPoint *boxmax,bool bGrowBox)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  bool rc;
  ON_3dPoint *pOStack_60;
  bool invalid;
  double *bmax;
  double *bmin;
  undefined1 local_38 [4];
  int dim;
  ON_Workspace ws;
  bool bGrowBox_local;
  ON_3dPoint *boxmax_local;
  ON_3dPoint *boxmin_local;
  ON_Geometry *this_local;
  
  ws.m_pMemBlk._7_1_ = bGrowBox;
  ON_Workspace::ON_Workspace((ON_Workspace *)local_38);
  iVar2 = (*(this->super_ON_Object)._vptr_ON_Object[0x18])();
  pOStack_60 = boxmax;
  bmax = &boxmin->x;
  if (3 < iVar2) {
    bmax = ON_Workspace::GetDoubleMemory((ON_Workspace *)local_38,(long)(iVar2 * 2));
    pOStack_60 = (ON_3dPoint *)(bmax + iVar2);
    memset(bmax,0,(long)(iVar2 << 1) << 3);
    if ((ws.m_pMemBlk._7_1_ & 1) != 0) {
      *bmax = boxmin->x;
      bmax[1] = boxmin->y;
      bmax[1] = boxmin->z;
      pOStack_60->x = boxmax->x;
      pOStack_60->y = boxmax->y;
      pOStack_60->y = boxmax->z;
    }
  }
  bVar1 = false;
  if ((((ws.m_pMemBlk._7_1_ & 1) != 0) &&
      (bVar1 = true, boxmin->x < boxmax->x || boxmin->x == boxmax->x)) &&
     (bVar1 = true, boxmin->y < boxmax->y || boxmin->y == boxmax->y)) {
    bVar1 = boxmax->z <= boxmin->z && boxmin->z != boxmax->z;
  }
  if (((ws.m_pMemBlk._7_1_ & 1) != 0) && (bVar1)) {
    ws.m_pMemBlk._7_1_ = 0;
  }
  uVar3 = (*(this->super_ON_Object)._vptr_ON_Object[0x19])
                    (this,bmax,pOStack_60,(ulong)(ws.m_pMemBlk._7_1_ & 1));
  if (iVar2 < 4) {
    if (iVar2 < 3) {
      boxmin->z = 0.0;
      boxmax->z = 0.0;
      if (iVar2 < 2) {
        boxmin->y = 0.0;
        boxmax->y = 0.0;
      }
    }
  }
  else {
    boxmin->x = *bmax;
    boxmin->y = bmax[1];
    boxmin->z = bmax[2];
    boxmax->x = pOStack_60->x;
    boxmax->y = pOStack_60->y;
    boxmax->z = pOStack_60->z;
  }
  ON_Workspace::~ON_Workspace((ON_Workspace *)local_38);
  return (uVar3 & 1) != 0;
}

Assistant:

bool 
ON_Geometry::GetBoundingBox( // returns true if successful
  ON_3dPoint& boxmin,
  ON_3dPoint& boxmax,
  bool bGrowBox
  ) const
{
  ON_Workspace ws;
  const int dim = Dimension();
  double *bmin, *bmax;
  if ( dim <= 3 ) {
    bmin = &boxmin.x;
    bmax = &boxmax.x;
  }
  else {
    bmin = ws.GetDoubleMemory(dim*2);
    bmax = bmin+dim;
    memset( bmin, 0, 2*dim*sizeof(*bmin) );
    if ( bGrowBox ) {
      bmin[0] = boxmin.x; bmin[1] = boxmin.y; bmin[1] = boxmin.z;
      bmax[0] = boxmax.x; bmax[1] = boxmax.y; bmax[1] = boxmax.z;
    }
  }
	// Treat invalid box on input as empty
	bool invalid=false;	//input box invalid=empty
	if(bGrowBox)
		invalid =  boxmin.x>boxmax.x || boxmin.y>boxmax.y|| boxmin.z>boxmax.z;
	if(bGrowBox && invalid)
		bGrowBox=false;

  const bool rc = (0 != GetBBox( bmin, bmax, bGrowBox ));
  if ( dim > 3 ) {
    boxmin.x = bmin[0]; boxmin.y = bmin[1]; boxmin.z = bmin[2];
    boxmax.x = bmax[0]; boxmax.y = bmax[1]; boxmax.z = bmax[2];
  }
  else if ( dim <= 2 ) {
    boxmin.z = 0.0;
    boxmax.z = 0.0;
    if ( dim <= 1 ) {
      boxmin.y = 0.0;
      boxmax.y = 0.0;
    }
  }
  return rc;
}